

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FillLeftBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  double dVar2;
  Point *pPVar3;
  Point *pPVar4;
  double dVar5;
  
  while( true ) {
    dVar5 = node->point->x;
    if (dVar5 < edge->p->x || dVar5 == edge->p->x) {
      return;
    }
    pPVar3 = node->prev->point;
    pPVar4 = node->prev->prev->point;
    dVar1 = pPVar4->x;
    dVar2 = pPVar4->y;
    dVar5 = (pPVar3->y - dVar2) * (dVar5 - dVar1) - (pPVar3->x - dVar1) * (node->point->y - dVar2);
    if ((1e-12 <= ABS(dVar5)) && (dVar5 <= 0.0)) break;
    FillLeftConvexEdgeEvent(this,tcx,edge,node);
  }
  FillLeftConcaveEdgeEvent(this,tcx,edge,node);
  return;
}

Assistant:

void Sweep::FillLeftBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x > edge->p->x) {
    if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
      // Concave
      FillLeftConcaveEdgeEvent(tcx, edge, node);
    } else {
      // Convex
      FillLeftConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillLeftBelowEdgeEvent(tcx, edge, node);
    }
  }
}